

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O3

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  WriteBarrierPtr<TestObject> *addr;
  WriteBarrierPtr<TestObject> *pWVar1;
  TestObject *pTVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  
  if ((index < 0) ||
     (iVar5 = (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count,
     iVar5 <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    iVar5 = (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count;
  }
  if (index + 1 < iVar5) {
    lVar7 = (long)(index + 1);
    do {
      pWVar1 = (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.
               ptr;
      addr = pWVar1 + index;
      pTVar2 = pWVar1[lVar7].ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pTVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      index = index + 1;
      lVar7 = lVar7 + 1;
      iVar5 = (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count;
    } while (lVar7 < iVar5);
  }
  (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count = iVar5 + -1;
  (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr[iVar5 + -1]
  .ptr = (TestObject *)0x0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }